

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Parser.h
# Opt level: O0

void __thiscall
soul::heart::Parser::scanStateVariable(Parser *this,ScannedTopLevelItem *item,bool isConstant)

{
  vector<soul::UTF8Reader,_std::allocator<soul::UTF8Reader>_> *this_00;
  undefined1 local_28 [15];
  bool local_19;
  UTF8Reader UStack_18;
  bool isConstant_local;
  ScannedTopLevelItem *item_local;
  Parser *this_local;
  
  local_19 = isConstant;
  UStack_18.data = (char *)item;
  item_local = (ScannedTopLevelItem *)this;
  ignoreUnused<bool&>(&local_19);
  this_00 = (vector<soul::UTF8Reader,_std::allocator<soul::UTF8Reader>_> *)(UStack_18.data + 0x88);
  Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
  getCurrentTokeniserPosition
            ((Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
              *)local_28);
  std::vector<soul::UTF8Reader,_std::allocator<soul::UTF8Reader>_>::push_back
            (this_00,(value_type *)local_28);
  skipPastNextOccurrenceOf(this,(TokenType)0x4ad30b);
  return;
}

Assistant:

void scanStateVariable (ScannedTopLevelItem& item, bool isConstant)
    {
        ignoreUnused (isConstant);

        item.stateVariableDecls.push_back (getCurrentTokeniserPosition());
        skipPastNextOccurrenceOf (HEARTOperator::semicolon);
    }